

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int ffgtvf(fitsfile *gfptr,long *firstfailed,int *status)

{
  int iVar1;
  char *__format;
  long member;
  long lVar2;
  fitsfile *fptr;
  long nmembers;
  long local_88;
  long ngroups;
  char errstr [71];
  
  nmembers = 0;
  ngroups = 0;
  fptr = (fitsfile *)0x0;
  if (*status != 0) {
    return *status;
  }
  *firstfailed = 0;
  iVar1 = ffgtnm(gfptr,&nmembers,status);
  *status = iVar1;
  for (member = 1; member <= nmembers; member = member + 1) {
    if (*status != 0) goto LAB_00172118;
    iVar1 = ffgmop(gfptr,member,&fptr,status);
    *status = iVar1;
    ffclos(fptr,status);
  }
  if (*status == 0) {
    iVar1 = ffgmng(gfptr,&ngroups,status);
    *status = iVar1;
    lVar2 = 0;
    if (0 < ngroups) {
      lVar2 = ngroups;
    }
    local_88 = lVar2 + 1;
    for (member = 1; member - lVar2 != 1; member = member + 1) {
      if (*status != 0) goto LAB_001721cb;
      iVar1 = ffgtop(gfptr,(int)member,&fptr,status);
      *status = iVar1;
      ffclos(fptr,status);
    }
    member = local_88;
    if (*status == 0) goto LAB_0017213e;
LAB_001721cb:
    *firstfailed = -member;
    __format = "Group table verify failed for GRPID index %ld (ffgtvf)";
  }
  else {
LAB_00172118:
    *firstfailed = member;
    __format = "Group table verify failed for member %ld (ffgtvf)";
  }
  snprintf(errstr,0x47,__format,member);
  ffpmsg(errstr);
LAB_0017213e:
  return *status;
}

Assistant:

int ffgtvf(fitsfile *gfptr,       /* FITS file pointer to group             */
	   long     *firstfailed, /* Member ID (if positive) of first failed
				     member HDU verify check or GRPID index
				     (if negitive) of first failed group
				     link verify check.                     */
	   int      *status)      /* return status code                     */

/*
 check the integrity of a grouping table to make sure that all group members 
 are accessible and all the links to other grouping tables are valid. The
 firstfailed parameter returns the member ID of the first member HDU to fail
 verification if positive or the first group link to fail if negative; 
 otherwise firstfailed contains a return value of 0.
*/

{
  long i;
  long nmembers = 0;
  long ngroups  = 0;

  char errstr[FLEN_VALUE];

  fitsfile *fptr = NULL;


  if(*status != 0) return(*status);

  *firstfailed = 0;

  do
    {
      /*
	attempt to open all the members of the grouping table. We stop
	at the first member which cannot be opened (which implies that it
	cannot be located)
      */

      *status = fits_get_num_members(gfptr,&nmembers,status);

      for(i = 1; i <= nmembers && *status == 0; ++i)
	{
	  *status = fits_open_member(gfptr,i,&fptr,status);
	  fits_close_file(fptr,status);
	}

      /*
	if the status is non-zero from the above loop then record the
	member index that caused the error
      */

      if(*status != 0)
	{
	  *firstfailed = i;
	  snprintf(errstr,FLEN_VALUE,"Group table verify failed for member %ld (ffgtvf)",
		  i);
	  ffpmsg(errstr);
	  continue;
	}

      /*
	attempt to open all the groups linked to this grouping table. We stop
	at the first group which cannot be opened (which implies that it
	cannot be located)
      */

      *status = fits_get_num_groups(gfptr,&ngroups,status);

      for(i = 1; i <= ngroups && *status == 0; ++i)
	{
	  *status = fits_open_group(gfptr,i,&fptr,status);
	  fits_close_file(fptr,status);
	}

      /*
	if the status from the above loop is non-zero, then record the
	GRPIDn index of the group that caused the failure
      */

      if(*status != 0)
	{
	  *firstfailed = -1*i;
	  snprintf(errstr,FLEN_VALUE,
		  "Group table verify failed for GRPID index %ld (ffgtvf)",i);
	  ffpmsg(errstr);
	  continue;
	}

    }while(0);

  return(*status);
}